

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwitchingFunction.cpp
# Opt level: O1

void __thiscall OpenMD::SwitchingFunction::SwitchingFunction(SwitchingFunction *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  CubicSpline *pCVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined1 local_29;
  CubicSpline *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  this->functionType_ = cubic;
  this->haveSpline_ = false;
  this->isCubic_ = true;
  this->np_ = 0x96;
  (this->switchSpline_).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->switchSpline_).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_28 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::CubicSpline,std::allocator<OpenMD::CubicSpline>>
            (a_Stack_20,&local_28,(allocator<OpenMD::CubicSpline> *)&local_29);
  _Var2._M_pi = a_Stack_20[0]._M_pi;
  pCVar1 = local_28;
  local_28 = (CubicSpline *)0x0;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->switchSpline_).
            super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->switchSpline_).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       pCVar1;
  (this->switchSpline_).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
  }
  return;
}

Assistant:

SwitchingFunction::SwitchingFunction() :
      functionType_(cubic), haveSpline_(false), isCubic_(true), np_(150) {
    switchSpline_ = std::make_shared<CubicSpline>();
  }